

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O3

bool __thiscall irr::video::COpenGLSLMaterialRenderer::linkProgram(COpenGLSLMaterialRenderer *this)

{
  GLuint GVar1;
  int iVar2;
  char *pcVar3;
  Printer *this_00;
  long lVar4;
  code *pcVar5;
  ulong uVar6;
  int iVar7;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar8;
  undefined4 in_XMM0_Db;
  double dVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  GLint num;
  GLint maxlen;
  GLint status;
  GLint maxLength;
  GLint size;
  u32 local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [32];
  undefined1 local_48 [4];
  GLint local_44;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *local_40;
  undefined1 local_34 [4];
  
  dVar9 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  lVar4 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
  if (this->Program2 == 0) {
    if (*(code **)(lVar4 + 0x750) != (code *)0x0) {
      dVar9 = (double)(**(code **)(lVar4 + 0x750))(this->Program);
      lVar4 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
    }
    local_6c = 0;
    if ((*(code **)(lVar4 + 0x7d8) == (code *)0x0) ||
       (dVar9 = (double)(**(code **)(lVar4 + 0x7d8))(this->Program,0x8b82,&local_6c), local_6c == 0)
       ) {
      dVar9 = os::Printer::log((Printer *)"GLSL shader program failed to link",dVar9);
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
      if (pcVar5 == (code *)0x0) {
        return false;
      }
      (*pcVar5)(SUB84(dVar9,0),this->Program,0x8b84,local_68);
      uVar6 = (ulong)(int)local_68._0_4_;
      if (uVar6 == 0) {
        return false;
      }
      this_00 = (Printer *)operator_new__(uVar6);
      GVar1 = this->Program;
      pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7c0);
      uVar8 = extraout_XMM0_Da_00;
      uVar10 = extraout_XMM0_Db_00;
      goto LAB_001eb6be;
    }
    local_74 = 0;
    pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
    if (pcVar5 == (code *)0x0) {
      return true;
    }
    dVar9 = (double)(*pcVar5)(this->Program,0x8b86,&local_74);
    if (local_74 == 0) {
      return true;
    }
    local_70 = 0;
    pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
    if (pcVar5 != (code *)0x0) {
      dVar9 = (double)(*pcVar5)(this->Program,0x8b87,&local_70);
      if ((long)local_70 != 0) {
        uVar6 = (long)local_70 + 1;
        local_70 = (int)uVar6;
        pcVar3 = (char *)operator_new__(uVar6);
        local_68._0_8_ =
             (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_68._8_8_ =
             (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_68._16_8_ =
             (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->UniformInfo).m_data.
        super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (this->UniformInfo).m_data.
        super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->UniformInfo).m_data.
        super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ::~vector((vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
                   *)local_68);
        (this->UniformInfo).is_sorted = true;
        local_40 = &this->UniformInfo;
        core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
                  (&this->UniformInfo,local_74,true);
        if (0 < (int)local_74) {
          iVar7 = 0;
          do {
            iVar2 = local_70;
            local_68._8_8_ = (pointer)0x0;
            local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
            local_68._0_8_ = (pointer)(local_68 + 0x10);
            memset(pcVar3,0,(long)local_70);
            pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x8a8);
            if (pcVar5 != (code *)0x0) {
              (*pcVar5)(this->Program,iVar7,iVar2,0,local_34,local_48,pcVar3);
            }
            core::string<char>::operator=((string<char> *)local_68,pcVar3);
            pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7f0);
            if (pcVar5 == (code *)0x0) {
              local_44 = 0;
            }
            else {
              local_44 = (*pcVar5)(this->Program,pcVar3);
            }
            ::std::
            vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
            ::push_back(&local_40->m_data,(value_type *)local_68);
            (this->UniformInfo).is_sorted = false;
            if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
              operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < (int)local_74);
        }
        goto LAB_001eb64b;
      }
    }
    pcVar3 = "GLSL: failed to retrieve uniform information";
  }
  else {
    if (*(code **)(lVar4 + 0x7b8) != (code *)0x0) {
      dVar9 = (double)(**(code **)(lVar4 + 0x7b8))();
      lVar4 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
    }
    local_6c = 0;
    if ((*(code **)(lVar4 + 0x7e8) == (code *)0x0) ||
       (dVar9 = (double)(**(code **)(lVar4 + 0x7e8))(this->Program2,0x8b82,&local_6c), local_6c == 0
       )) {
      dVar9 = os::Printer::log((Printer *)"GLSL (> 2.x) shader program failed to link",dVar9);
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
      if (pcVar5 == (code *)0x0) {
        return false;
      }
      (*pcVar5)(SUB84(dVar9,0),this->Program2,0x8b84,local_68);
      uVar6 = (ulong)(int)local_68._0_4_;
      if (uVar6 == 0) {
        return false;
      }
      this_00 = (Printer *)operator_new__(uVar6);
      GVar1 = this->Program2;
      pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 2000);
      uVar8 = extraout_XMM0_Da;
      uVar10 = extraout_XMM0_Db;
LAB_001eb6be:
      dVar9 = (double)CONCAT44(uVar10,uVar8);
      local_74 = 0;
      if (pcVar5 != (code *)0x0) {
        dVar9 = (double)(*pcVar5)(GVar1,uVar6 & 0xffffffff,&local_74,this_00);
      }
      os::Printer::log(this_00,dVar9);
      operator_delete__(this_00);
      return false;
    }
    local_74 = 0;
    pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
    if (pcVar5 == (code *)0x0) {
      return true;
    }
    dVar9 = (double)(*pcVar5)(this->Program2,0x8b86,&local_74);
    if (local_74 == 0) {
      return true;
    }
    local_70 = 0;
    pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
    if (pcVar5 != (code *)0x0) {
      dVar9 = (double)(*pcVar5)(this->Program2,0x8b87,&local_70);
      if ((long)local_70 != 0) {
        uVar6 = (long)local_70 + 1;
        local_70 = (int)uVar6;
        pcVar3 = (char *)operator_new__(uVar6);
        local_68._0_8_ =
             (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_68._8_8_ =
             (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_68._16_8_ =
             (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->UniformInfo).m_data.
        super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (this->UniformInfo).m_data.
        super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->UniformInfo).m_data.
        super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ::~vector((vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
                   *)local_68);
        (this->UniformInfo).is_sorted = true;
        local_40 = &this->UniformInfo;
        core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
                  (&this->UniformInfo,local_74,true);
        if (0 < (int)local_74) {
          iVar7 = 0;
          do {
            iVar2 = local_70;
            local_68._8_8_ = (pointer)0x0;
            local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
            local_68._0_8_ = (pointer)(local_68 + 0x10);
            memset(pcVar3,0,(long)local_70);
            pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x8b0);
            if (pcVar5 != (code *)0x0) {
              (*pcVar5)(this->Program2,iVar7,iVar2,0,local_34,local_48,pcVar3);
            }
            core::string<char>::operator=((string<char> *)local_68,pcVar3);
            pcVar5 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7f8);
            if (pcVar5 == (code *)0x0) {
              local_44 = 0;
            }
            else {
              local_44 = (*pcVar5)(this->Program2,pcVar3);
            }
            ::std::
            vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
            ::push_back(&local_40->m_data,(value_type *)local_68);
            (this->UniformInfo).is_sorted = false;
            if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
              operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < (int)local_74);
        }
LAB_001eb64b:
        operator_delete__(pcVar3);
        return true;
      }
    }
    pcVar3 = "GLSL (> 2.x): failed to retrieve uniform information";
  }
  os::Printer::log((Printer *)pcVar3,dVar9);
  return false;
}

Assistant:

bool COpenGLSLMaterialRenderer::linkProgram()
{
	if (Program2) {
		Driver->extGlLinkProgram(Program2);

		GLint status = 0;

#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_LINK_STATUS, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL (> 2.x) shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_VERSION_2_0
			Driver->extGlGetProgramiv(Program2, GL_INFO_LOG_LENGTH, &maxLength);
#endif
			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				Driver->extGlGetProgramInfoLog(Program2, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORMS, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORM_MAX_LENGTH, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL (> 2.x): failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (GLint i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniform(Program2, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLchar *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocation(Program2, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	} else {
		Driver->extGlLinkProgramARB(Program);

		GLint status = 0;

#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_LINK_STATUS_ARB, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_ARB_shader_objects
			Driver->extGlGetObjectParameteriv(Program,
					GL_OBJECT_INFO_LOG_LENGTH_ARB, &maxLength);
#endif
			if (maxLength) {
				GLcharARB *infoLog = new GLcharARB[maxLength];
				Driver->extGlGetInfoLog(Program, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORMS_ARB, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORM_MAX_LENGTH_ARB, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL: failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (int i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniformARB(Program, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLcharARB *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocationARB(Program, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	}

	return true;
}